

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection_impl.hpp
# Opt level: O3

void __thiscall
websocketpp::connection<websocketpp::config::asio>::log_fail_result
          (connection<websocketpp::config::asio> *this)

{
  char *pcVar1;
  _Base_ptr p_Var2;
  element_type *peVar3;
  pointer pcVar4;
  error_category *peVar5;
  basic<websocketpp::concurrency::basic,_websocketpp::log::alevel> *this_00;
  char *pcVar6;
  int iVar7;
  const_iterator cVar8;
  ulong uVar9;
  ostream *poVar10;
  basic_ostream<char,_std::char_traits<char>_> *pbVar11;
  _Base_ptr __n;
  string ua;
  stringstream s;
  undefined1 local_258 [32];
  string local_238;
  char *local_218;
  size_type local_210;
  char local_208 [8];
  undefined8 uStack_200;
  undefined1 *local_1f8;
  _Base_ptr local_1f0;
  undefined1 local_1e8 [16];
  undefined1 *local_1d8;
  long local_1d0;
  undefined1 local_1c8 [16];
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  std::__cxx11::stringstream::stringstream(local_1b8);
  iVar7 = processor::get_websocket_version<websocketpp::http::parser::request>(&this->m_request);
  std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"WebSocket Connection ",0x15);
  transport::asio::connection<websocketpp::config::asio::transport_config>::
  get_remote_endpoint_abi_cxx11_(&local_238,&this->super_transport_con_type);
  std::__ostream_insert<char,std::char_traits<char>>
            (local_1a8,local_238._M_dataplus._M_p,local_238._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._M_dataplus._M_p != &local_238.field_2) {
    operator_delete(local_238._M_dataplus._M_p);
  }
  if (iVar7 < 0) {
    std::__ostream_insert<char,std::char_traits<char>>(local_1a8," -",2);
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>(local_1a8," v",2);
    std::ostream::operator<<(local_1a8,iVar7);
  }
  pcVar1 = local_258 + 0x10;
  local_258._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_258,"User-Agent","");
  cVar8 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_websocketpp::utility::ci_less,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::find(&(this->m_request).super_parser.m_headers._M_t,(key_type *)local_258);
  __n = (_Base_ptr)&http::empty_header_abi_cxx11_;
  if ((_Rb_tree_header *)cVar8._M_node !=
      &(this->m_request).super_parser.m_headers._M_t._M_impl.super__Rb_tree_header) {
    __n = cVar8._M_node + 2;
  }
  local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_238,*(long *)__n,(long)&__n->_M_parent->_M_color + *(long *)__n);
  if ((char *)local_258._0_8_ != pcVar1) {
    operator_delete((void *)local_258._0_8_);
  }
  if (local_238._M_string_length == 0) {
    std::__ostream_insert<char,std::char_traits<char>>(local_1a8," \"\" ",4);
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>(local_1a8," \"",2);
    local_218 = local_208;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_218,local_238._M_dataplus._M_p,
               local_238._M_dataplus._M_p + local_238._M_string_length);
    local_1f8 = local_1e8;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f8,"\"","");
    local_1d8 = local_1c8;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d8,"\\\"","");
    __n = local_1f0;
    uVar9 = std::__cxx11::string::find((char *)&local_218,(ulong)local_1f8,0);
    if (uVar9 != 0xffffffffffffffff) {
      do {
        std::__cxx11::string::replace((ulong)&local_218,uVar9,(char *)local_1f0,(ulong)local_1d8);
        __n = local_1f0;
        uVar9 = std::__cxx11::string::find((char *)&local_218,(ulong)local_1f8,uVar9 + local_1d0);
      } while (uVar9 != 0xffffffffffffffff);
    }
    local_258._8_8_ = local_210;
    if (local_218 == local_208) {
      local_258._24_8_ = uStack_200;
      local_218 = pcVar1;
    }
    local_210 = 0;
    local_208[0] = '\0';
    local_258._0_8_ = local_218;
    pcVar6 = local_218;
    local_218 = local_208;
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>(local_1a8,pcVar6,local_258._8_8_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\" ",2);
    if ((char *)local_258._0_8_ != pcVar1) {
      operator_delete((void *)local_258._0_8_);
    }
    if (local_1d8 != local_1c8) {
      operator_delete(local_1d8);
    }
    if (local_1f8 != local_1e8) {
      operator_delete(local_1f8);
    }
    if (local_218 != local_208) {
      operator_delete(local_218);
    }
  }
  peVar3 = (this->m_uri).super___shared_ptr<websocketpp::uri,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (peVar3 == (element_type *)0x0) {
    local_258._0_8_ = local_258 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_258,"-","");
  }
  else {
    __n = (_Base_ptr)(local_258 + 0x10);
    pcVar4 = (peVar3->m_resource)._M_dataplus._M_p;
    local_258._0_8_ = __n;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_258,pcVar4,pcVar4 + (peVar3->m_resource)._M_string_length);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            (local_1a8,(char *)local_258._0_8_,local_258._8_8_);
  p_Var2 = (_Base_ptr)(local_258 + 0x10);
  if ((_Base_ptr)local_258._0_8_ != p_Var2) {
    operator_delete((void *)local_258._0_8_);
  }
  std::__ostream_insert<char,std::char_traits<char>>(local_1a8," ",1);
  std::ostream::operator<<(local_1a8,(this->m_response).m_status_code);
  std::__ostream_insert<char,std::char_traits<char>>(local_1a8," ",1);
  pbVar11 = std::operator<<(local_1a8,&this->m_ec);
  std::__ostream_insert<char,std::char_traits<char>>(pbVar11," ",1);
  peVar5 = (this->m_ec)._M_cat;
  (**(code **)(*(long *)peVar5 + 0x20))(local_258,peVar5,(this->m_ec)._M_value);
  std::__ostream_insert<char,std::char_traits<char>>
            (pbVar11,(char *)local_258._0_8_,local_258._8_8_);
  if ((_Base_ptr)local_258._0_8_ != p_Var2) {
    operator_delete((void *)local_258._0_8_);
  }
  this_00 = (this->m_alog).
            super___shared_ptr<websocketpp::log::basic<websocketpp::concurrency::basic,_websocketpp::log::alevel>,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr;
  std::__cxx11::stringbuf::str();
  log::basic<websocketpp::concurrency::basic,_websocketpp::log::alevel>::write
            (this_00,0x2000,local_258,(size_t)__n);
  if ((_Base_ptr)local_258._0_8_ != p_Var2) {
    operator_delete((void *)local_258._0_8_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._M_dataplus._M_p != &local_238.field_2) {
    operator_delete(local_238._M_dataplus._M_p);
  }
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  return;
}

Assistant:

void connection<config>::log_fail_result()
{
    std::stringstream s;
    
    int version = processor::get_websocket_version(m_request);

    // Connection Type
    s << "WebSocket Connection ";

    // Remote endpoint address & WebSocket version
    s << transport_con_type::get_remote_endpoint();
    if (version < 0) {
        s << " -";
    } else {
        s << " v" << version;
    }

    // User Agent
    std::string ua = m_request.get_header("User-Agent");
    if (ua.empty()) {
        s << " \"\" ";
    } else {
        // check if there are any quotes in the user agent
        s << " \"" << utility::string_replace_all(ua,"\"","\\\"") << "\" ";
    }

    // URI
    s << (m_uri ? m_uri->get_resource() : "-");

    // HTTP Status code
    s  << " " << m_response.get_status_code();
    
    // WebSocket++ error code & reason
    s << " " << m_ec << " " << m_ec.message();

    m_alog->write(log::alevel::fail,s.str());
}